

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

uint64_t roaring_bitmap_range_cardinality_closed
                   (roaring_bitmap_t *r,uint32_t range_start,uint32_t range_end)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint8_t uVar3;
  uint uVar4;
  int iVar5;
  int32_t n_runs;
  long lVar6;
  int iVar7;
  ushort x;
  ushort uVar8;
  ulong uVar9;
  long lVar10;
  run_container_t *prVar11;
  uint uVar12;
  uint uVar13;
  uint64_t uVar14;
  
  if (range_end < range_start) {
    return 0;
  }
  uVar13 = range_end >> 0x10;
  iVar7 = (r->high_low_container).size;
  x = (ushort)range_end;
  if ((long)iVar7 == 0) {
LAB_0011f0aa:
    uVar12 = iVar7 - 1;
LAB_0011f0ae:
    if (-1 < (int)uVar12) {
LAB_0011f0b7:
      prVar11 = (run_container_t *)(r->high_low_container).containers[uVar12];
      uVar3 = (r->high_low_container).typecodes[uVar12];
      if (range_start >> 0x10 == uVar13) {
        if (uVar3 == '\x04') {
          uVar3 = *(uint8_t *)&prVar11->runs;
          prVar11 = *(run_container_t **)prVar11;
        }
        if (uVar3 == '\x03') {
          iVar7 = run_container_rank(prVar11,x);
        }
        else if (uVar3 == '\x02') {
          if (prVar11->n_runs < 1) {
            iVar7 = 0;
          }
          else {
            iVar7 = prVar11->n_runs + -1;
            iVar5 = 0;
            do {
              uVar4 = (uint)(iVar7 + iVar5) >> 1;
              uVar8 = *(ushort *)((long)&prVar11->runs->value + (ulong)(iVar7 + iVar5 & 0xfffffffe))
              ;
              if (uVar8 < x) {
                iVar5 = uVar4 + 1;
              }
              else {
                if (uVar8 <= x) {
                  iVar7 = uVar4 + 1;
                  goto LAB_0011f224;
                }
                iVar7 = uVar4 - 1;
              }
            } while (iVar5 <= iVar7);
            iVar7 = -iVar5;
            if (0 < iVar5) {
              iVar7 = iVar5;
            }
          }
        }
        else {
          iVar7 = bitset_container_rank((bitset_container_t *)prVar11,x);
        }
      }
      else {
        if (uVar3 == '\x04') {
          uVar3 = *(uint8_t *)&prVar11->runs;
          prVar11 = *(run_container_t **)prVar11;
        }
        if (uVar3 == '\x03') {
          uVar4 = croaring_hardware_support();
          if ((uVar4 & 2) == 0) {
            uVar4 = croaring_hardware_support();
            if ((uVar4 & 1) == 0) {
              iVar7 = prVar11->n_runs;
              lVar6 = (long)iVar7;
              if (0 < lVar6) {
                lVar10 = 0;
                do {
                  iVar7 = iVar7 + (uint)prVar11->runs[lVar10].length;
                  lVar10 = lVar10 + 1;
                } while (lVar6 != lVar10);
              }
            }
            else {
              iVar7 = _avx2_run_container_cardinality(prVar11);
            }
          }
          else {
            iVar7 = _avx512_run_container_cardinality(prVar11);
          }
        }
        else {
          iVar7 = prVar11->n_runs;
        }
      }
LAB_0011f224:
      uVar14 = (uint64_t)iVar7;
      if ((short)range_start != 0) {
        prVar11 = (run_container_t *)(r->high_low_container).containers[uVar12];
        uVar3 = (r->high_low_container).typecodes[uVar12];
        uVar8 = (short)range_start - 1;
        if (uVar3 == '\x04') {
          uVar3 = *(uint8_t *)&prVar11->runs;
          prVar11 = *(run_container_t **)prVar11;
        }
        if (uVar3 == '\x03') {
          iVar7 = run_container_rank(prVar11,uVar8);
        }
        else if (uVar3 == '\x02') {
          if (prVar11->n_runs < 1) {
            iVar7 = 0;
          }
          else {
            iVar7 = prVar11->n_runs + -1;
            iVar5 = 0;
            do {
              uVar4 = (uint)(iVar7 + iVar5) >> 1;
              uVar1 = *(ushort *)((long)&prVar11->runs->value + (ulong)(iVar7 + iVar5 & 0xfffffffe))
              ;
              if (uVar1 < uVar8) {
                iVar5 = uVar4 + 1;
              }
              else {
                if (uVar1 <= uVar8) {
                  iVar7 = uVar4 + 1;
                  goto LAB_0011f2a5;
                }
                iVar7 = uVar4 - 1;
              }
            } while (iVar5 <= iVar7);
            iVar7 = -iVar5;
            if (0 < iVar5) {
              iVar7 = iVar5;
            }
          }
        }
        else {
          iVar7 = bitset_container_rank((bitset_container_t *)prVar11,uVar8);
        }
LAB_0011f2a5:
        uVar14 = uVar14 - (long)iVar7;
      }
      uVar12 = uVar12 + 1;
      iVar7 = (r->high_low_container).size;
      goto LAB_0011f2b0;
    }
  }
  else {
    puVar2 = (r->high_low_container).keys;
    uVar8 = (ushort)(range_start >> 0x10);
    if (puVar2[(long)iVar7 + -1] == uVar8) goto LAB_0011f0aa;
    if (0 < iVar7) {
      iVar5 = iVar7 + -1;
      uVar4 = 0;
      do {
        uVar12 = iVar5 + uVar4 >> 1;
        uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar5 + uVar4 & 0xfffffffe));
        if (uVar1 < uVar8) {
          uVar4 = uVar12 + 1;
        }
        else {
          if (uVar1 <= uVar8) goto LAB_0011f0b7;
          iVar5 = uVar12 - 1;
        }
      } while ((int)uVar4 <= iVar5);
      uVar12 = ~uVar4;
      goto LAB_0011f0ae;
    }
    uVar12 = 0xffffffff;
  }
  uVar12 = ~uVar12;
  uVar14 = 0;
LAB_0011f2b0:
  if ((int)uVar12 < iVar7) {
    uVar9 = (ulong)uVar12;
    do {
      uVar12 = (uint)(r->high_low_container).keys[uVar9];
      if (uVar13 <= uVar12) {
        if (uVar13 != uVar12) {
          return uVar14;
        }
        prVar11 = (run_container_t *)(r->high_low_container).containers[uVar9];
        uVar3 = (r->high_low_container).typecodes[uVar9];
        if (uVar3 == '\x04') {
          uVar3 = *(uint8_t *)&prVar11->runs;
          prVar11 = *(run_container_t **)prVar11;
        }
        if (uVar3 == '\x03') {
          iVar7 = run_container_rank(prVar11,x);
          goto LAB_0011f3ce;
        }
        if (uVar3 != '\x02') {
          iVar7 = bitset_container_rank((bitset_container_t *)prVar11,x);
          goto LAB_0011f3ce;
        }
        if (0 < prVar11->n_runs) {
          iVar7 = prVar11->n_runs + -1;
          iVar5 = 0;
          goto LAB_0011f38b;
        }
        iVar7 = 0;
        goto LAB_0011f3ce;
      }
      prVar11 = (run_container_t *)(r->high_low_container).containers[uVar9];
      uVar3 = (r->high_low_container).typecodes[uVar9];
      if (uVar3 == '\x04') {
        uVar3 = *(uint8_t *)&prVar11->runs;
        prVar11 = *(run_container_t **)prVar11;
      }
      if (uVar3 == '\x03') {
        uVar12 = croaring_hardware_support();
        if ((uVar12 & 2) == 0) {
          uVar12 = croaring_hardware_support();
          if ((uVar12 & 1) == 0) {
            iVar7 = prVar11->n_runs;
            lVar6 = (long)iVar7;
            if (0 < lVar6) {
              lVar10 = 0;
              do {
                iVar7 = iVar7 + (uint)prVar11->runs[lVar10].length;
                lVar10 = lVar10 + 1;
              } while (lVar6 != lVar10);
            }
          }
          else {
            iVar7 = _avx2_run_container_cardinality(prVar11);
          }
        }
        else {
          iVar7 = _avx512_run_container_cardinality(prVar11);
        }
      }
      else {
        iVar7 = prVar11->n_runs;
      }
      uVar14 = uVar14 + (long)iVar7;
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < (r->high_low_container).size);
  }
  return uVar14;
LAB_0011f38b:
  do {
    uVar13 = (uint)(iVar7 + iVar5) >> 1;
    uVar8 = *(ushort *)((long)&prVar11->runs->value + (ulong)(iVar7 + iVar5 & 0xfffffffe));
    if (uVar8 < x) {
      iVar5 = uVar13 + 1;
    }
    else {
      if (uVar8 <= x) {
        iVar7 = uVar13 + 1;
        goto LAB_0011f3ce;
      }
      iVar7 = uVar13 - 1;
    }
  } while (iVar5 <= iVar7);
  iVar7 = -iVar5;
  if (0 < iVar5) {
    iVar7 = iVar5;
  }
LAB_0011f3ce:
  return uVar14 + (long)iVar7;
}

Assistant:

uint64_t roaring_bitmap_range_cardinality_closed(const roaring_bitmap_t *r,
                                                 uint32_t range_start,
                                                 uint32_t range_end) {
    const roaring_array_t *ra = &r->high_low_container;

    if (range_start > range_end) {
        return 0;
    }

    // now we have: 0 <= range_start <= range_end <= UINT32_MAX

    uint16_t minhb = (uint16_t)(range_start >> 16);
    uint16_t maxhb = (uint16_t)(range_end >> 16);

    uint64_t card = 0;

    int i = ra_get_index(ra, minhb);
    if (i >= 0) {
        if (minhb == maxhb) {
            card += container_rank(ra->containers[i], ra->typecodes[i],
                                   range_end & 0xffff);
        } else {
            card +=
                container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        }
        if ((range_start & 0xffff) != 0) {
            card -= container_rank(ra->containers[i], ra->typecodes[i],
                                   (range_start & 0xffff) - 1);
        }
        i++;
    } else {
        i = -i - 1;
    }

    for (; i < ra->size; i++) {
        uint16_t key = ra->keys[i];
        if (key < maxhb) {
            card +=
                container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        } else if (key == maxhb) {
            card += container_rank(ra->containers[i], ra->typecodes[i],
                                   range_end & 0xffff);
            break;
        } else {
            break;
        }
    }

    return card;
}